

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefix.cpp
# Opt level: O2

void __thiscall
duckdb::Prefix::Prefix(Prefix *this,ART *art,Node ptr_p,bool is_mutable,bool set_in_memory)

{
  FixedSizeAllocator *this_00;
  data_ptr_t pdVar1;
  Node *pNVar2;
  bool bVar3;
  undefined3 in_register_00000081;
  
  this_00 = Node::GetAllocator(art,PREFIX);
  if (CONCAT31(in_register_00000081,set_in_memory) == 0) {
    pdVar1 = FixedSizeAllocator::Get(this_00,ptr_p.super_IndexPointer.data,is_mutable);
    this->data = pdVar1;
  }
  else {
    pdVar1 = FixedSizeAllocator::GetIfLoaded(this_00,ptr_p.super_IndexPointer.data);
    this->data = pdVar1;
    if (pdVar1 == (data_ptr_t)0x0) {
      pNVar2 = (Node *)0x0;
      bVar3 = false;
      goto LAB_009f7085;
    }
  }
  pNVar2 = (Node *)(pdVar1 + (ulong)art->prefix_count + 1);
  bVar3 = true;
LAB_009f7085:
  this->ptr = pNVar2;
  this->in_memory = bVar3;
  return;
}

Assistant:

Prefix::Prefix(const ART &art, const Node ptr_p, const bool is_mutable, const bool set_in_memory) {
	if (!set_in_memory) {
		data = Node::GetAllocator(art, PREFIX).Get(ptr_p, is_mutable);
	} else {
		data = Node::GetAllocator(art, PREFIX).GetIfLoaded(ptr_p);
		if (!data) {
			ptr = nullptr;
			in_memory = false;
			return;
		}
	}
	ptr = reinterpret_cast<Node *>(data + Count(art) + 1);
	in_memory = true;
}